

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void ctemplate::TemplateDictionary::AddToIdToNameMap(TemplateId id,TemplateString *str)

{
  TemplateString str_with_id;
  TemplateString local_20;
  
  if (str->id_ != 0) {
    return;
  }
  local_20.ptr_ = str->ptr_;
  local_20.length_ = str->length_;
  local_20.is_immutable_ = str->is_immutable_;
  local_20.id_ = id;
  TemplateString::AddToGlobalIdToNameMap(&local_20);
  return;
}

Assistant:

void TemplateDictionary::AddToIdToNameMap(TemplateId id,
                                                     const TemplateString& str) {
  // If str.id_ is set, that means we were added to the id-to-name map
  // at TemplateString constructor time, when the id_ was set.  So we
  // don't need to bother again here.
  if (str.id_ != 0) {
    return;
  }
  // Verify that if this id is already in the map, it's there with our
  // contents.  If not, that would mean a hash collision (since our
  // id's are hash values).
  DCHECK(TemplateString::IdToString(id) == kStsEmpty ||
         memcmp(str.ptr_, TemplateString::IdToString(id).ptr_,
                str.length_) == 0)
                    << string(str.ptr_, str.length_) << " vs "
                    << string(TemplateString::IdToString(id).ptr_,
                              TemplateString::IdToString(id).length_);
  TemplateString str_with_id(str.ptr_, str.length_, str.is_immutable(), id);
  str_with_id.AddToGlobalIdToNameMap();
}